

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

void __thiscall Solution::print(Solution *this)

{
  Vehicle *pVVar1;
  bool bVar2;
  reference ppPVar3;
  reference ppVVar4;
  reference psVar5;
  element_type *peVar6;
  ostream *poVar7;
  undefined1 local_80 [8];
  shared_ptr<VehicleState> node;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_> *__range2;
  Vehicle *vehicle;
  iterator __end1_1;
  iterator __begin1_1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range1_1;
  Point *local_30;
  Point *point;
  iterator __end1;
  iterator __begin1;
  list<Point_*,_std::allocator<Point_*>_> *__range1;
  Solution *this_local;
  
  __end1 = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::begin(&Utils::raw_rows_abi_cxx11_)
  ;
  point = (Point *)std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::end
                             (&Utils::raw_rows_abi_cxx11_);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&point);
    if (!bVar2) break;
    ppPVar3 = std::_List_iterator<Point_*>::operator*(&__end1);
    local_30 = *ppPVar3;
    __range1_1 = &this->vehicles;
    std::
    unordered_map<Solution_*,_std::pair<Vehicle_*,_int>,_std::hash<Solution_*>,_std::equal_to<Solution_*>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>_>
    ::erase(&local_30->state,(key_type *)&__range1_1);
    std::_List_iterator<Point_*>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&this->vehicles);
  vehicle = (Vehicle *)
            std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::end(&this->vehicles);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&vehicle);
    if (!bVar2) break;
    ppVVar4 = std::_List_iterator<Vehicle_*>::operator*(&__end1_1);
    pVVar1 = *ppVVar4;
    __end2 = std::__cxx11::
             list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
             begin(&pVVar1->nodes);
    node.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::
         list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::end
                   (&pVVar1->nodes);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&node.
                                                super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
      if (!bVar2) break;
      psVar5 = std::_List_iterator<std::shared_ptr<VehicleState>_>::operator*(&__end2);
      std::shared_ptr<VehicleState>::shared_ptr((shared_ptr<VehicleState> *)local_80,psVar5);
      peVar6 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,peVar6->p->id);
      std::operator<<(poVar7," ");
      std::shared_ptr<VehicleState>::~shared_ptr((shared_ptr<VehicleState> *)local_80);
      std::_List_iterator<std::shared_ptr<VehicleState>_>::operator++(&__end2);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::_List_iterator<Vehicle_*>::operator++(&__end1_1);
  }
  return;
}

Assistant:

void Solution::print() {
    for (auto point: Utils::raw_rows) {
        point->state.erase(this);
    }

    for (auto vehicle: vehicles) {
        for (auto node: vehicle->nodes) {
            std::cout << node->p->id << " ";
        }
        std::cout << "\n";
    }
}